

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O1

bool __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
render_variable(basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,render_handler *handler,
               basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *var,context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *ctx,bool escaped)

{
  type tVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  streamstring ss;
  long *local_1b8 [2];
  long local_1a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198 [3];
  ios_base local_128 [264];
  
  tVar1 = var->type_;
  if (tVar1 == lambda2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "Lambda with render argument is not allowed for regular variables",0x40);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)this,(string *)local_1b8);
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0],local_1a8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
    return false;
  }
  if (tVar1 == lambda) {
    local_198[0]._M_string_length = 0;
    local_198[0].field_2._M_local_buf[0] = '\0';
    local_198[0]._M_dataplus._M_p = (pointer)&local_198[0].field_2;
    bVar4 = render_lambda(this,handler,var,ctx,(uint)!escaped,local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198[0]._M_dataplus._M_p == &local_198[0].field_2) {
      return bVar4;
    }
  }
  else {
    bVar4 = true;
    if (tVar1 != string) {
      return true;
    }
    pbVar2 = (var->str_)._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (escaped) {
      if ((this->escape_).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->escape_)._M_invoker)(local_198,(_Any_data *)&this->escape_,pbVar2);
    }
    else {
      local_198[0]._M_dataplus._M_p = (pointer)&local_198[0].field_2;
      _Var3._M_p = (pbVar2->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_198,_Var3._M_p,_Var3._M_p + pbVar2->_M_string_length);
    }
    std::__cxx11::string::_M_append((char *)&ctx->line_buffer,(ulong)local_198[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198[0]._M_dataplus._M_p == &local_198[0].field_2) {
      return true;
    }
  }
  operator_delete(local_198[0]._M_dataplus._M_p,
                  CONCAT71(local_198[0].field_2._M_allocated_capacity._1_7_,
                           local_198[0].field_2._M_local_buf[0]) + 1);
  return bVar4;
}

Assistant:

bool render_variable(const render_handler& handler, const basic_data<string_type>* var, context_internal<string_type>& ctx, bool escaped) {
        if (var->is_string()) {
            const auto& varstr = var->string_value();
            render_result(ctx, escaped ? escape_(varstr) : varstr);
        } else if (var->is_lambda()) {
            const render_lambda_escape escape_opt = escaped ? render_lambda_escape::escape : render_lambda_escape::unescape;
            return render_lambda(handler, var, ctx, escape_opt, {}, false);
        } else if (var->is_lambda2()) {
            using streamstring = std::basic_ostringstream<typename string_type::value_type>;
            streamstring ss;
            ss << "Lambda with render argument is not allowed for regular variables";
            error_message_ = ss.str();
            return false;
        }
        return true;
    }